

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite_list.hpp
# Opt level: O2

void __thiscall
beast::unit_test::suite_list::insert<jbcoin::tests::ValidatorKeysTool_test>
          (suite_list *this,char *name,char *module,char *library,bool manual)

{
  uint __line;
  __ireturn_type _Var1;
  __ireturn_type _Var2;
  allocator local_1c1;
  char *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  string local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string s;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string((string *)&local_118,library,&local_1c1);
  ::std::operator+(&local_f8,&local_118,".");
  ::std::operator+(&local_1b8,&local_f8,module);
  ::std::operator+(&local_198,&local_1b8,".");
  local_1c0 = module;
  ::std::operator+(&local_d8,&local_198,name);
  ::std::__cxx11::string::operator=((string *)&s,(string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_198);
  ::std::__cxx11::string::~string((string *)&local_1b8);
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::__cxx11::string::~string((string *)&local_118);
  _Var1 = ::std::__detail::
          _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&this->names_,&s);
  if (((undefined1  [16])_Var1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __line = 0x3c;
  }
  else {
    ::std::__cxx11::string::~string((string *)&s);
    s._M_dataplus._M_p = "\x10x0";
    _Var2 = ::std::__detail::
            _Insert<std::type_index,_std::type_index,_std::allocator<std::type_index>,_std::__detail::_Identity,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            ::insert((_Insert<std::type_index,_std::type_index,_std::allocator<std::type_index>,_std::__detail::_Identity,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)&this->classes_,(value_type *)&s);
    if (((undefined1  [16])_Var2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      ::std::__cxx11::string::string((string *)&local_138,name,(allocator *)&local_d8);
      ::std::__cxx11::string::string((string *)&local_158,local_1c0,(allocator *)&local_198);
      ::std::__cxx11::string::string((string *)&local_178,library,(allocator *)&local_1b8);
      make_suite_info<jbcoin::tests::ValidatorKeysTool_test>
                ((suite_info *)&s,&local_138,&local_158,&local_178,manual);
      ::std::
      _Rb_tree<beast::unit_test::suite_info,_beast::unit_test::suite_info,_std::_Identity<beast::unit_test::suite_info>,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>
      ::_M_emplace_unique<beast::unit_test::suite_info>
                ((_Rb_tree<beast::unit_test::suite_info,_beast::unit_test::suite_info,_std::_Identity<beast::unit_test::suite_info>,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>
                  *)this,(suite_info *)&s);
      suite_info::~suite_info((suite_info *)&s);
      ::std::__cxx11::string::~string((string *)&local_178);
      ::std::__cxx11::string::~string((string *)&local_158);
      ::std::__cxx11::string::~string((string *)&local_138);
      return;
    }
    __line = 0x42;
  }
  __assert_fail("result.second",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/beast/extras/beast/unit_test/suite_list.hpp"
                ,__line,
                "void beast::unit_test::suite_list::insert(const char *, const char *, const char *, bool) [Suite = jbcoin::tests::ValidatorKeysTool_test]"
               );
}

Assistant:

void
suite_list::insert(
    char const* name,
    char const* module,
    char const* library,
    bool manual)
{
#ifndef NDEBUG
    {
        std::string s;
        s = std::string(library) + "." + module + "." + name;
        auto const result(names_.insert(s));
        BOOST_ASSERT(result.second); // Duplicate name
    }

    {
        auto const result(classes_.insert(
            std::type_index(typeid(Suite))));
        BOOST_ASSERT(result.second); // Duplicate type
    }
#endif
    cont().emplace(make_suite_info<Suite>(
        name, module, library, manual));
}